

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::tightenCoefficients
          (HighsDomain *this,HighsInt *inds,double *vals,HighsInt len,double *rhs)

{
  double *pdVar1;
  ulong uVar2;
  HighsInt i;
  int iVar3;
  double dVar4;
  double dVar5;
  HighsCDouble HVar6;
  HighsCDouble maxabscoef;
  HighsCDouble delta;
  HighsCDouble upper;
  HighsCDouble local_88;
  HighsCDouble local_78;
  HighsCDouble local_68;
  HighsCDouble local_58;
  HighsCDouble local_48;
  double *local_38;
  
  local_58.hi = 0.0;
  local_58.lo = 0.0;
  for (uVar2 = 0; (uint)len != uVar2; uVar2 = uVar2 + 1) {
    if (vals[uVar2] <= 0.0) {
      dVar4 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[inds[uVar2]];
      if (dVar4 <= -INFINITY) {
        return;
      }
    }
    else {
      dVar4 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[inds[uVar2]];
      if (INFINITY <= dVar4) {
        return;
      }
    }
    dVar4 = vals[uVar2] * dVar4;
    dVar5 = dVar4 + local_58.hi;
    local_58.lo = local_58.lo +
                  (local_58.hi - (dVar5 - dVar4)) + (dVar4 - (dVar5 - (dVar5 - dVar4)));
    local_58.hi = dVar5;
  }
  HVar6 = HighsCDouble::operator-(&local_58,*rhs);
  dVar4 = HVar6.hi + HVar6.lo;
  pdVar1 = &((this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
  if (*pdVar1 <= dVar4 && dVar4 != *pdVar1) {
    local_48.hi = *rhs;
    local_48.lo = 0.0;
    uVar2 = 0;
    iVar3 = 0;
    local_88 = HVar6;
    local_38 = rhs;
    while( true ) {
      if ((uint)len == uVar2) break;
      if ((this->mipsolver->model_->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[inds[uVar2]] != kContinuous) {
        dVar4 = vals[uVar2];
        if (dVar4 <= HVar6.hi + HVar6.lo) {
          if (-HVar6.lo - HVar6.hi <= dVar4) goto LAB_002a5c66;
          local_68 = operator-(-dVar4,&local_88);
          local_78 = HighsCDouble::operator*
                               (&local_68,
                                (this->col_lower_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[inds[uVar2]]);
          HighsCDouble::operator+=(&local_48,&local_78);
          vals[uVar2] = -(local_88.hi + local_88.lo);
        }
        else {
          local_68 = operator-(dVar4,&local_88);
          local_78 = HighsCDouble::operator*
                               (&local_68,
                                (this->col_upper_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[inds[uVar2]]);
          HighsCDouble::operator-=(&local_48,&local_78);
          vals[uVar2] = local_88.hi + local_88.lo;
        }
        HVar6.lo = local_88.lo;
        HVar6.hi = local_88.hi;
        iVar3 = iVar3 + 1;
      }
LAB_002a5c66:
      uVar2 = uVar2 + 1;
    }
    if (iVar3 != 0) {
      *local_38 = local_48.hi + local_48.lo;
    }
  }
  return;
}

Assistant:

void HighsDomain::tightenCoefficients(HighsInt* inds, double* vals,
                                      HighsInt len, double& rhs) const {
  HighsCDouble maxactivity = 0;

  for (HighsInt i = 0; i != len; ++i) {
    if (vals[i] > 0) {
      if (col_upper_[inds[i]] == kHighsInf) return;

      maxactivity += col_upper_[inds[i]] * vals[i];
    } else {
      if (col_lower_[inds[i]] == -kHighsInf) return;

      maxactivity += col_lower_[inds[i]] * vals[i];
    }
  }

  HighsCDouble maxabscoef = maxactivity - rhs;
  if (maxabscoef > mipsolver->mipdata_->feastol) {
    HighsCDouble upper = rhs;
    HighsInt tightened = 0;
    for (HighsInt i = 0; i != len; ++i) {
      if (mipsolver->variableType(inds[i]) == HighsVarType::kContinuous)
        continue;
      if (vals[i] > maxabscoef) {
        HighsCDouble delta = vals[i] - maxabscoef;
        upper -= delta * col_upper_[inds[i]];
        vals[i] = double(maxabscoef);
        ++tightened;
      } else if (vals[i] < -maxabscoef) {
        HighsCDouble delta = -vals[i] - maxabscoef;
        upper += delta * col_lower_[inds[i]];
        vals[i] = -double(maxabscoef);
        ++tightened;
      }
    }

    if (tightened != 0) {
      // printf("tightened %" HIGHSINT_FORMAT " coefficients, rhs changed from
      // %g to %g\n",
      //       tightened, rhs, double(upper));
      rhs = double(upper);
    }
  }
}